

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b085::der_operators_log_e_Test::TestBody(der_operators_log_e_Test *this)

{
  char *pcVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar;
  
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"f::f(1.0f)","0.0f",0.0,0.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
               ,0x5e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"f::d(1.0f)","1.0f",1.0,1.0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_58);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                 ,0x5f,pcVar1);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"f::d(10.0f)","0.1f",0.1,0.1);
      if (gtest_ar.success_ != false) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        dVar2 = dnet::derivative::
                op_div<dnet::derivative::op_ln<dnet::derivative::variant>,_dnet::derivative::op_ln<dnet::derivative::constant<(anonymous_namespace)::E>_>_>
                ::d(10.0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)&gtest_ar,"g::d(10.0f)","0.1f",(float)dVar2,0.1);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_58);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                     ,0x61,pcVar1);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_58);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        for (dVar2 = 0.1; dVar2 < 10.0; dVar2 = dVar2 + 0.1) {
          dVar3 = log(dVar2);
          dVar4 = log(dVar2);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"f::f(x)","g::f(x)",(float)dVar3,
                     (float)(dVar4 * 1.000000030367861));
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_58);
            pcVar1 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                       ,100,pcVar1);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_58);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          dVar3 = dnet::derivative::
                  op_div<dnet::derivative::op_ln<dnet::derivative::variant>,_dnet::derivative::op_ln<dnet::derivative::constant<(anonymous_namespace)::E>_>_>
                  ::d(dVar2);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)&gtest_ar,"f::d(x)","g::d(x)",(float)(1.0 / dVar2),(float)dVar3);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_58);
            pcVar1 = "";
            if (gtest_ar.message_.ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                       ,0x65,pcVar1);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_58);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
        }
        return;
      }
      testing::Message::Message((Message *)&local_58);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/derivative/operators_test.cc"
                 ,0x60,pcVar1);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_60);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(der_operators, log_e)
    {
        // y = lnx
        // dy/dx = 1/x
        typedef op_ln<variant> f;
        typedef op_div<op_ln<variant>, op_ln<constant<E>>> g;
        ASSERT_FLOAT_EQ(f::f(1.0f), 0.0f);
        ASSERT_FLOAT_EQ(f::d(1.0f), 1.0f);
        ASSERT_FLOAT_EQ(f::d(10.0f), 0.1f);
        EXPECT_FLOAT_EQ(g::d(10.0f), 0.1f);
        for (double x = 0.1; x < 10.0; x += 0.1)
        {
            EXPECT_FLOAT_EQ(f::f(x), g::f(x));
            EXPECT_FLOAT_EQ(f::d(x), g::d(x));
        }
    }